

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

Result __thiscall
tonk::Connection::completeIncomingConnection(Connection *this,UDPAddress *peerUDPAddress)

{
  TonkAppContextPtr pvVar1;
  _func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *p_Var2;
  bool bVar3;
  Channel *pCVar4;
  TonkConnection pTVar5;
  char *pcVar6;
  Connection *in_RSI;
  ErrorResult *in_RDI;
  Result flushResult;
  uint32_t appDecision;
  TonkAddress appAddress;
  Result *result;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  basic_endpoint<asio::ip::udp> *in_stack_fffffffffffff7b8;
  LogStringBuffer *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  ErrorType in_stack_fffffffffffff7cc;
  string *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  LogStringBuffer *pLVar7;
  Connection *in_stack_fffffffffffff7e0;
  Result *in_stack_fffffffffffff7e8;
  LogStringBuffer *in_stack_fffffffffffff7f8;
  LogStringBuffer *buffer_00;
  undefined4 in_stack_fffffffffffff800;
  uint in_stack_fffffffffffff804;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff808;
  uint32_t in_stack_fffffffffffff80c;
  Connection *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff837;
  Connection *in_stack_fffffffffffff8a8;
  Channel *peerUDPAddress_00;
  Connection *in_stack_fffffffffffff8d8;
  long local_6d8;
  allocator local_6c9;
  string local_6c8 [32];
  undefined8 local_6a8;
  uint32_t local_6a0;
  undefined6 in_stack_fffffffffffff970;
  uint16_t in_stack_fffffffffffff976;
  string *in_stack_fffffffffffff978;
  char *local_670 [7];
  string local_638 [32];
  string local_618 [39];
  undefined1 local_5f1;
  undefined8 local_5c8;
  undefined4 local_5bc;
  string *local_5b8;
  char *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_550;
  char **local_540;
  long *local_528;
  char *local_518;
  Channel *local_510;
  string *local_508;
  char *local_500;
  LogStringBuffer *local_4f8;
  char *local_4f0;
  undefined4 local_4e4;
  Channel *local_4e0;
  undefined4 local_4d4;
  Channel *local_4d0;
  undefined1 local_4b8 [16];
  ostream aoStack_4a8 [376];
  char *local_330;
  undefined4 local_324;
  Channel *local_320;
  char *local_318;
  string *local_310;
  undefined1 *local_308;
  Channel *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  Channel *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  Channel *local_2d0;
  string *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  string *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  string *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  char *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  LogStringBuffer *local_28;
  string *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_5f1 = 0;
  in_RDI->Source = (char *)0x0;
  peerUDPAddress_00 = &in_RSI->Logger;
  asio::ip::basic_endpoint<asio::ip::udp>::address(in_stack_fffffffffffff7b8);
  asio::ip::address::to_string_abi_cxx11_
            ((address *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x1319ba);
  GetConnectionLogPrefix(in_stack_fffffffffffff978,in_stack_fffffffffffff976);
  logger::Channel::SetPrefix((Channel *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_638);
  initSubsystems(in_stack_fffffffffffff8a8);
  local_540 = local_670;
  in_RDI->Source = local_670[0];
  local_670[0] = (char *)0x0;
  Result::~Result((Result *)in_stack_fffffffffffff7c0);
  if (in_RDI->Source == (char *)0x0) {
    SessionOutgoing::SetPeerUDPAddress
              ((SessionOutgoing *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
               (UDPAddress *)in_stack_fffffffffffff7f8);
    resetTimers(in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
                SUB41((uint)in_stack_fffffffffffff808 >> 0x18,0));
    bVar3 = ConnectionIdMap::InsertAndAssignId
                      ((ConnectionIdMap *)in_stack_fffffffffffff810,
                       (id_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (IConnection *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800))
    ;
    if (!bVar3) {
      pCVar4 = &in_RSI->Logger;
      local_518 = "completeConnectionInitialization: Failed to insert new connection into id map";
      local_4e4 = 3;
      local_4f0 = "completeConnectionInitialization: Failed to insert new connection into id map";
      local_4d4 = 3;
      local_510 = pCVar4;
      local_4e0 = pCVar4;
      local_4d0 = pCVar4;
      if ((int)(in_RSI->Logger).ChannelMinLevel < 4) {
        local_324 = 3;
        local_330 = "completeConnectionInitialization: Failed to insert new connection into id map";
        local_320 = pCVar4;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8,Trace);
        local_310 = &(in_RSI->Logger).Prefix;
        local_308 = local_4b8;
        local_318 = local_330;
        local_300 = pCVar4;
        local_2f8 = local_310;
        local_2f0 = local_308;
        local_2e8 = pCVar4;
        local_2c8 = local_310;
        local_2c0 = local_308;
        std::operator<<(aoStack_4a8,(string *)local_310);
        local_2d8 = local_308;
        local_2e0 = local_318;
        local_2b0 = local_308;
        local_2b8 = local_318;
        local_2d0 = pCVar4;
        std::operator<<((ostream *)(local_308 + 0x10),local_318);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  ((OutputWorker *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                   in_stack_fffffffffffff7f8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x131e35);
      }
    }
    queueAddressAndIdChangeMessage(in_stack_fffffffffffff8d8,(UDPAddress *)peerUDPAddress_00);
    SetTonkAddressStr((TonkAddress *)in_stack_fffffffffffff810,
                      (UDPAddress *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    pvVar1 = in_RSI->SocketConfig->AppContextPtr;
    p_Var2 = in_RSI->SocketConfig->OnIncomingConnection;
    pTVar5 = GetTonkConnection(in_RSI);
    local_6a0 = (*p_Var2)(pvVar1,pTVar5,(TonkAddress *)&stack0xfffffffffffff966,
                          &in_RSI->ConnectionConfig);
    if (local_6a0 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6c8,"Application OnIncomingConnection() callback denied connection",
                 &local_6c9);
      local_5a8 = &local_6a8;
      local_5b0 = "Connection::completeConnectionInitialization";
      local_5b8 = local_6c8;
      local_5bc = 0;
      local_5c8 = 2;
      pcVar6 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                ((ErrorResult *)in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8,
                 in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
                 (ErrorCodeT)in_stack_fffffffffffff7c0);
      local_550 = &local_6a8;
      in_RDI->Source = pcVar6;
      local_6a8 = 0;
      Result::~Result((Result *)in_stack_fffffffffffff7c0);
      std::__cxx11::string::~string(local_6c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    }
    else {
      MakeCallbacksOptional((TonkConnectionConfig *)in_stack_fffffffffffff7c0);
      SessionOutgoing::Flush
                ((SessionOutgoing *)CONCAT26(in_stack_fffffffffffff976,in_stack_fffffffffffff970));
      local_528 = &local_6d8;
      in_stack_fffffffffffff837 = local_6d8 != 0;
      if ((bool)in_stack_fffffffffffff837) {
        RefCounter::StartShutdown
                  ((RefCounter *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                   in_stack_fffffffffffff804,(Result *)in_stack_fffffffffffff7f8);
      }
      postNextTimer(in_stack_fffffffffffff7e0);
      Result::~Result((Result *)in_stack_fffffffffffff7c0);
    }
  }
  bVar3 = in_RDI->Source != (char *)0x0;
  uVar8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff804);
  if (bVar3) {
    pLVar7 = (LogStringBuffer *)&in_RSI->Logger;
    Result::ToJson_abi_cxx11_(in_stack_fffffffffffff7e8);
    local_500 = "Connection::completeIncomingConnection failed: ";
    local_508 = (string *)&stack0xfffffffffffff8d8;
    local_294 = 3;
    local_2a0 = "Connection::completeIncomingConnection failed: ";
    local_284 = 3;
    local_4f8 = pLVar7;
    local_2a8 = local_508;
    local_290 = pLVar7;
    local_280 = pLVar7;
    if ((int)pLVar7->LogLevel < 4) {
      local_cc = 3;
      local_d8 = "Connection::completeIncomingConnection failed: ";
      buffer_00 = pLVar7;
      local_e0 = local_508;
      local_c8 = pLVar7;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff7c0,(char *)in_stack_fffffffffffff7b8,Trace);
      local_b0 = (string *)&pLVar7->field_0x38;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_a0 = pLVar7;
      local_98 = local_b0;
      local_90 = local_a8;
      local_88 = pLVar7;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,(string *)local_b0);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_48 = local_a8;
      local_50 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      local_58 = pLVar7;
      local_40 = pLVar7;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_30 = local_60;
      local_38 = local_70;
      local_18 = local_60;
      local_20 = local_70;
      local_28 = pLVar7;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT44(uVar8,in_stack_fffffffffffff800),buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x132783);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff8d8);
    Shutdown((Connection *)CONCAT17(in_stack_fffffffffffff837,in_stack_fffffffffffff830));
  }
  return (Result)in_RDI;
}

Assistant:

Result Connection::completeIncomingConnection(const UDPAddress& peerUDPAddress)
{
    Result result;

    try
    {
        Logger.SetPrefix(GetConnectionLogPrefix(
            peerUDPAddress.address().to_string(),
            peerUDPAddress.port()));

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Update the peer address for outgoing data
        Outgoing.SetPeerUDPAddress(peerUDPAddress);

        // Initialize timers for incoming connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, true);

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("completeConnectionInitialization: Failed to insert new connection into id map");
        }

        // Write control channel data before the OnConnect() callback so that
        // any tonk_flush() will include the control channel data in the first
        // UDP response datagram
        queueAddressAndIdChangeMessage(peerUDPAddress);

        TonkAddress appAddress;
        SetTonkAddressStr(appAddress, peerUDPAddress);

        // FIXME: If this asserts we currently seem to shut down uncleanly
        const uint32_t appDecision = SocketConfig->OnIncomingConnection(
            SocketConfig->AppContextPtr,
            GetTonkConnection(),
            &appAddress,
            &ConnectionConfig);
        if (TONK_DENY_CONNECTION == appDecision)
        {
            result = Result("Connection::completeConnectionInitialization", "Application OnIncomingConnection() callback denied connection", ErrorType::Tonk);
            goto OnError;
        }

        MakeCallbacksOptional(ConnectionConfig);

        // TBD: We could call OnConnect() here and some apps may have lower
        // latency to establish connections.  It is already possible to react
        // with the same speed to the OnIncomingConnection() callback though.
        // Right now OnConnect() is called when the first ID update control
        // message is received from the client.
        //ConnectionConfig.OnConnect(ConnectionConfig.AppContextPtr, GetTonkConnection());

        /*
            For the server, we do not want to delay delivery of the client's ID
            until the next timed or application flush, so perform a flush here.
            This still allows the application to submit data in the first round.
        */
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());

        // Buffer enough flush space for the first connection request message
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        postNextTimer();
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::completeConnectionInitialization", "Exception!", ErrorType::Tonk);
        goto OnError;
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::completeIncomingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}